

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O0

void mpp_put_align(BitputCtx_t *bp,RK_S32 align_bits,int flag)

{
  char cVar1;
  int local_24;
  uint local_20;
  RK_U32 len;
  RK_U32 word_offset;
  int flag_local;
  RK_S32 align_bits_local;
  BitputCtx_t *bp_local;
  
  if (align_bits < 0x40) {
    local_24 = 0;
  }
  else {
    local_24 = (bp->index & ((int)(align_bits & 0xfe0U) >> 6) - 1U) << 6;
  }
  local_20 = (uint)(align_bits - (local_24 + (int)((long)(ulong)bp->bitpos % (long)align_bits))) %
             (uint)align_bits;
  while (local_20 != 0) {
    if (local_20 < 8) {
      cVar1 = (char)local_20;
      if (flag == 0) {
        mpp_put_bits(bp,(ulong)(0L << (0x40U - cVar1 & 0x3f)) >> (0x40U - cVar1 & 0x3f),local_20);
      }
      else {
        mpp_put_bits(bp,(ulong)(-1L << (0x40U - cVar1 & 0x3f)) >> (0x40U - cVar1 & 0x3f),local_20);
      }
      local_20 = 0;
    }
    else {
      if (flag == 0) {
        mpp_put_bits(bp,0,8);
      }
      else {
        mpp_put_bits(bp,0xff,8);
      }
      local_20 = local_20 - 8;
    }
  }
  return;
}

Assistant:

void mpp_put_align(BitputCtx_t *bp, RK_S32 align_bits, int flag)
{
    RK_U32 word_offset = 0,  len = 0;

    word_offset = (align_bits >= 64) ? ((bp->index & (((align_bits & 0xfe0) >> 6) - 1)) << 6) : 0;
    len = (align_bits - (word_offset + (bp->bitpos % align_bits))) % align_bits;
    while (len > 0) {
        if (len >= 8) {
            if (flag == 0)
                mpp_put_bits(bp, ((RK_U64)0 << (64 - 8)) >> (64 - 8), 8);
            else
                mpp_put_bits(bp, (0xffffffffffffffff << (64 - 8)) >> (64 - 8), 8);
            len -= 8;
        } else {
            if (flag == 0)
                mpp_put_bits(bp, ((RK_U64)0 << (64 - len)) >> (64 - len), len);
            else
                mpp_put_bits(bp, (0xffffffffffffffff << (64 - len)) >> (64 - len), len);
            len -= len;
        }
    }
}